

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

Comment * soul::SourceCodeUtilities::parseComment(Comment *__return_storage_ptr__,CodeLocation *pos)

{
  bool bVar1;
  UnicodeChar UVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  CodeLocation *pCVar10;
  undefined1 in_R8B;
  string_view sVar11;
  byte local_419;
  byte local_401;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  const_iterator local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  const_iterator local_2f0;
  anon_class_1_0_00000001_for__M_pred local_2e1;
  string local_2e0 [32];
  reference local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l_2;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  size_t local_290;
  reference local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  size_t leastLeadingSpace;
  undefined1 local_258 [7];
  anon_class_1_0_00000001 countLeadingSpaces;
  string local_248 [32];
  string local_228 [32];
  string_view local_208;
  string_view local_1f8;
  string local_1e8;
  undefined1 local_1c8 [8];
  string line;
  string local_188;
  string local_168;
  ulong local_148;
  size_type leadingSpacesOnLine;
  string local_120;
  reference local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  UTF8Reader UStack_d8;
  ulong local_d0;
  long firstLineIndent;
  string local_c0 [32];
  undefined1 local_a0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  UTF8Reader local_78;
  UTF8Reader closeComment;
  UTF8Reader local_60;
  undefined1 local_58 [8];
  Comment result;
  CodeLocation *pos_local;
  
  result.range.end.location.data = (char *)pos;
  bVar1 = CodeLocation::isEmpty(pos);
  if (bVar1) {
    __return_storage_ptr__->valid = false;
    __return_storage_ptr__->isStarSlash = false;
    __return_storage_ptr__->isDoxygenStyle = false;
    __return_storage_ptr__->isReferringBackwards = false;
    memset(&__return_storage_ptr__->lines,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->lines);
    memset(&__return_storage_ptr__->range,0,0x10);
    CodeLocation::CodeLocation(&(__return_storage_ptr__->range).start);
    pCVar10 = &(__return_storage_ptr__->range).end;
    memset(pCVar10,0,0x10);
    CodeLocation::CodeLocation(pCVar10);
    return __return_storage_ptr__;
  }
  Comment::Comment((Comment *)local_58);
  UTF8Reader::findEndOfWhitespace(&local_60);
  UTF8Reader::operator=(&pos->location,&local_60);
  CodeLocation::operator=
            ((CodeLocation *)
             &result.lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pos);
  bVar1 = UTF8Reader::advanceIfStartsWith(&pos->location,"/*");
  if (bVar1) {
    local_58[0] = true;
    local_58[1] = true;
    while (UVar2 = UTF8Reader::operator*(&pos->location), UVar2 == 0x2a) {
      local_58[2] = true;
      UTF8Reader::operator++(&pos->location);
    }
  }
  else {
    bVar1 = UTF8Reader::advanceIfStartsWith(&pos->location,"//");
    if (!bVar1) {
      __return_storage_ptr__->valid = false;
      __return_storage_ptr__->isStarSlash = false;
      __return_storage_ptr__->isDoxygenStyle = false;
      __return_storage_ptr__->isReferringBackwards = false;
      memset(&__return_storage_ptr__->lines,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->lines);
      memset(&__return_storage_ptr__->range,0,0x10);
      CodeLocation::CodeLocation(&(__return_storage_ptr__->range).start);
      pCVar10 = &(__return_storage_ptr__->range).end;
      memset(pCVar10,0,0x10);
      CodeLocation::CodeLocation(pCVar10);
      goto LAB_00323447;
    }
    local_58[0] = true;
    local_58[1] = false;
    while (UVar2 = UTF8Reader::operator*(&pos->location), UVar2 == 0x2f) {
      local_58[2] = true;
      UTF8Reader::operator++(&pos->location);
    }
  }
  bVar1 = UTF8Reader::advanceIfStartsWith(&pos->location,"<");
  if (bVar1) {
    local_58[3] = true;
  }
  while( true ) {
    UVar2 = UTF8Reader::operator*(&pos->location);
    if (UVar2 != 0x20) break;
    UTF8Reader::operator++(&pos->location);
  }
  if ((local_58[1] & 1U) == 0) {
    do {
      CodeLocation::getSourceLine_abi_cxx11_(&local_1e8,pos);
      choc::text::trim((string *)local_1c8,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c8);
      local_1f8 = sVar11;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,"//");
      bVar1 = choc::text::startsWith(local_1f8,local_208);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_228,(ulong)local_1c8);
        std::__cxx11::string::operator=((string *)local_1c8,local_228);
        std::__cxx11::string::~string(local_228);
        while( true ) {
          uVar3 = std::__cxx11::string::empty();
          bVar1 = false;
          if ((uVar3 & 1) == 0) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1c8);
            bVar1 = *pcVar4 == '/';
          }
          if (!bVar1) break;
          std::__cxx11::string::substr((ulong)local_248,(ulong)local_1c8);
          std::__cxx11::string::operator=((string *)local_1c8,local_248);
          std::__cxx11::string::~string(local_248);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result,(value_type *)local_1c8);
        CodeLocation::getStartOfNextLine((CodeLocation *)local_258);
        CodeLocation::operator=(pos,(CodeLocation *)local_258);
        CodeLocation::~CodeLocation((CodeLocation *)local_258);
        closeComment.data._0_4_ = 0;
      }
      else {
        closeComment.data._0_4_ = 10;
      }
      std::__cxx11::string::~string((string *)local_1c8);
    } while ((int)closeComment.data == 0);
    CodeLocation::operator=((CodeLocation *)&result.range.start.location,pos);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result);
    if (!bVar1) {
      __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3e8;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&result);
      l_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&l_1);
        if (!bVar1) break;
        local_288 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        sVar11 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_288);
        local_290 = parseComment::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&leastLeadingSpace + 7),sVar11);
        puVar9 = std::min<unsigned_long>((unsigned_long *)&__range3,&local_290);
        __range3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)*puVar9;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      if (__range3 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&result);
        l_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&l_2);
          if (!bVar1) break;
          local_2c0 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
          std::__cxx11::string::substr((ulong)local_2e0,(ulong)local_2c0);
          std::__cxx11::string::operator=((string *)local_2c0,local_2e0);
          std::__cxx11::string::~string(local_2e0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
      }
    }
  }
  else {
    UTF8Reader::find(&local_78,(char *)&pos->location);
    bVar1 = UTF8Reader::isEmpty(&local_78);
    if (bVar1) {
      __return_storage_ptr__->valid = false;
      __return_storage_ptr__->isStarSlash = false;
      __return_storage_ptr__->isDoxygenStyle = false;
      __return_storage_ptr__->isReferringBackwards = false;
      memset(&__return_storage_ptr__->lines,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->lines);
      memset(&__return_storage_ptr__->range,0,0x10);
      CodeLocation::CodeLocation(&(__return_storage_ptr__->range).start);
      pCVar10 = &(__return_storage_ptr__->range).end;
      memset(pCVar10,0,0x10);
      CodeLocation::CodeLocation(pCVar10);
      goto LAB_00323447;
    }
    pcVar4 = UTF8Reader::getAddress(&pos->location);
    pcVar5 = UTF8Reader::getAddress(&local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (local_c0,pcVar4,pcVar5,(allocator<char> *)((long)&firstLineIndent + 7));
    local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_c0);
    sVar11._M_len = local_a0._8_8_;
    sVar11._M_str = (char *)0x0;
    choc::text::splitIntoLines_abi_cxx11_(&local_90,local_a0._0_8_,sVar11,(bool)in_R8B);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&result,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&firstLineIndent + 7));
    pcVar4 = UTF8Reader::getAddress(&pos->location);
    CodeLocation::getStartOfLine((CodeLocation *)&__range2);
    pcVar5 = UTF8Reader::getAddress(&UStack_d8);
    CodeLocation::~CodeLocation((CodeLocation *)&__range2);
    local_d0 = (long)pcVar4 - (long)pcVar5;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&result);
    l = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&result);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&l);
      if (!bVar1) break;
      local_100 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      std::__cxx11::string::string((string *)&leadingSpacesOnLine,(string *)local_100);
      choc::text::trimEnd(&local_120,(string *)&leadingSpacesOnLine);
      std::__cxx11::string::operator=((string *)local_100,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&leadingSpacesOnLine);
      lVar6 = std::__cxx11::string::length();
      std::__cxx11::string::string((string *)&local_188,(string *)local_100);
      choc::text::trimStart(&local_168,&local_188);
      lVar7 = std::__cxx11::string::length();
      uVar8 = lVar6 - lVar7;
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      local_148 = uVar8;
      if ((0 < (long)local_d0) && (local_d0 <= uVar8)) {
        std::__cxx11::string::substr((ulong)((long)&line.field_2 + 8),(ulong)local_100);
        std::__cxx11::string::operator=
                  ((string *)local_100,(string *)(line.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    CodeLocation::operator=((CodeLocation *)&result.range.start.location,pos);
    pCVar10 = &result.range.end;
    UTF8Reader::operator=((UTF8Reader *)pCVar10,&local_78);
    UTF8Reader::operator+=((UTF8Reader *)pCVar10,2);
  }
  removeIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,soul::SourceCodeUtilities::parseComment(soul::CodeLocation)::__1>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&result,&local_2e1);
  while( true ) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result);
    local_401 = 0;
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&result);
      local_401 = std::__cxx11::string::empty();
    }
    if ((local_401 & 1) == 0) break;
    local_300._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&result);
    local_2f8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator-(&local_300,1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_2f0,&local_2f8);
    local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&result,local_2f0);
  }
  while( true ) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result);
    local_419 = 0;
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&result);
      local_419 = std::__cxx11::string::empty();
    }
    if ((local_419 & 1) == 0) break;
    local_318._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&result);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_310,&local_318);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result,local_310);
  }
  Comment::Comment(__return_storage_ptr__,(Comment *)local_58);
LAB_00323447:
  closeComment.data._0_4_ = 1;
  Comment::~Comment((Comment *)local_58);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::parseComment (CodeLocation pos)
{
    if (pos.isEmpty())
        return {};

    Comment result;
    pos.location = pos.location.findEndOfWhitespace();
    result.range.start = pos;

    if (pos.location.advanceIfStartsWith ("/*"))
    {
        result.valid = true;
        result.isStarSlash = true;

        while (*pos.location == '*')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else if (pos.location.advanceIfStartsWith ("//"))
    {
        result.valid = true;
        result.isStarSlash = false;

        while (*pos.location == '/')
        {
            result.isDoxygenStyle = true;
            ++(pos.location);
        }
    }
    else
    {
        return {};
    }

    if (pos.location.advanceIfStartsWith ("<"))
        result.isReferringBackwards = true;

    while (*pos.location == ' ')
        ++(pos.location);

    if (result.isStarSlash)
    {
        auto closeComment = pos.location.find ("*/");

        if (closeComment.isEmpty())
            return {};

        result.lines = choc::text::splitIntoLines (std::string (pos.location.getAddress(),
                                                                closeComment.getAddress()),
                                                   false);

        auto firstLineIndent = pos.location.getAddress() - pos.getStartOfLine().location.getAddress();

        for (auto& l : result.lines)
        {
            l = choc::text::trimEnd (l);
            auto leadingSpacesOnLine = l.length() - choc::text::trimStart (l).length();

            if (firstLineIndent > 0 && leadingSpacesOnLine >= (size_t) firstLineIndent)
                l = l.substr ((size_t) firstLineIndent);
        }

        result.range.end = pos;
        result.range.end.location = closeComment;
        result.range.end.location += 2;
    }
    else
    {
        for (;;)
        {
            auto line = choc::text::trim (pos.getSourceLine());

            if (! choc::text::startsWith (line, "//"))
                break;

            line = line.substr (2);

            while (! line.empty() && line[0] == '/')
                line = line.substr (1);

            result.lines.push_back (line);
            pos = pos.getStartOfNextLine();
        }

        result.range.end = pos;

        if (! result.lines.empty())
        {
            auto countLeadingSpaces = [] (std::string_view s) -> size_t
            {
                for (size_t i = 0; i < s.length(); ++i)
                    if (s[i] != ' ')
                        return i;

                return 0;
            };

            size_t leastLeadingSpace = 1000;

            for (auto& l : result.lines)
                leastLeadingSpace = std::min (leastLeadingSpace, countLeadingSpaces (l));

            if (leastLeadingSpace != 0)
                for (auto& l : result.lines)
                    l = l.substr (leastLeadingSpace);
        }
    }

    removeIf (result.lines, [] (const std::string& s) { return choc::text::contains (s, "================")
                                                            || choc::text::contains (s, "****************"); });

    while (! result.lines.empty() && result.lines.back().empty())
        result.lines.erase (result.lines.end() - 1);

    while (! result.lines.empty() && result.lines.front().empty())
        result.lines.erase (result.lines.begin());

    return result;
}